

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

String * __thiscall
kj::anon_unknown_0::tryParse
          (String *__return_storage_ptr__,anon_unknown_0 *this,WaitScope *waitScope,Network *network
          ,StringPtr text,uint portHint)

{
  Own<kj::NetworkAddress> OStack_38;
  Own<kj::_::PromiseNode> local_28;
  
  (*(code *)waitScope->loop->port)
            (&local_28,waitScope,network,text.content.ptr,text.content.size_ & 0xffffffff);
  Promise<kj::Own<kj::NetworkAddress>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress>_> *)&OStack_38,&local_28);
  (*(OStack_38.ptr)->_vptr_NetworkAddress[4])(__return_storage_ptr__);
  Own<kj::NetworkAddress>::dispose(&OStack_38);
  Own<kj::_::PromiseNode>::dispose(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String tryParse(WaitScope& waitScope, Network& network, StringPtr text, uint portHint = 0) {
  return network.parseAddress(text, portHint).wait(waitScope)->toString();
}